

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

XMLFilePos __thiscall xercesc_4_0::XMLReader::getSrcOffset(XMLReader *this)

{
  RuntimeException *this_00;
  XMLReader *this_local;
  
  if (((this->fSrcOfsSupported & 1U) != 0) && ((this->fCalculateSrcOfs & 1U) != 0)) {
    if (this->fCharIndex == 0) {
      this_local = (XMLReader *)this->fSrcOfsBase;
    }
    else if (this->fCharIndex < this->fCharsAvail) {
      this_local = (XMLReader *)(this->fSrcOfsBase + (ulong)this->fCharOfsBuf[this->fCharIndex]);
    }
    else {
      this_local = (XMLReader *)
                   (this->fSrcOfsBase + (ulong)this->fCharOfsBuf[this->fCharIndex - 1] +
                   (ulong)this->fCharSizeBuf[this->fCharIndex - 1]);
    }
    return (XMLFilePos)this_local;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
             ,0x1fc,Reader_SrcOfsNotSupported,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

XMLFilePos XMLReader::getSrcOffset() const
{
    if (!fSrcOfsSupported || !fCalculateSrcOfs)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_SrcOfsNotSupported, fMemoryManager);

    //
    //  Take the current source offset and add in the sizes that we've
    //  eaten from the source so far.
    //
    if( fCharIndex == 0 ) {
        return fSrcOfsBase;
    }

    if( fCharIndex < fCharsAvail ) {

        return (fSrcOfsBase + fCharOfsBuf[fCharIndex]);
    }

    return (fSrcOfsBase + fCharOfsBuf[fCharIndex-1] + fCharSizeBuf[fCharIndex-1]);
}